

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O2

void __thiscall
gmath::RationalTangentialDistortion::getProperties
          (RationalTangentialDistortion *this,Properties *prop,int id)

{
  int in_ECX;
  undefined4 in_register_00000014;
  string local_40;
  
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"p1",(char *)CONCAT44(in_register_00000014,id),
             in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->kd);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"p2",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 1);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k1",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 2);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k2",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 3);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k3",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 4);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k4",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 5);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k5",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 6);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k6",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 7);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void RationalTangentialDistortion::getProperties(gutil::Properties &prop, int id) const
{
  prop.putValue(getCameraKey("p1", id).c_str(), kd[0]);
  prop.putValue(getCameraKey("p2", id).c_str(), kd[1]);

  prop.putValue(getCameraKey("k1", id).c_str(), kd[2]);
  prop.putValue(getCameraKey("k2", id).c_str(), kd[3]);
  prop.putValue(getCameraKey("k3", id).c_str(), kd[4]);
  prop.putValue(getCameraKey("k4", id).c_str(), kd[5]);
  prop.putValue(getCameraKey("k5", id).c_str(), kd[6]);
  prop.putValue(getCameraKey("k6", id).c_str(), kd[7]);
}